

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O3

double __thiscall VCClusterQuad::energyWithoutItem(VCClusterQuad *this,VCFace *f)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  Vector3d zi;
  Matrix4d Eo;
  Vector3d local_a8;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  dVar9 = 0.0;
  if (1 < (this->super_VCCluster).items._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[1] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[1];
    local_88._8_4_ = SUB84(dVar9,0);
    local_88._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0];
    local_88._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[3] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[3];
    local_78._8_4_ = SUB84(dVar9,0);
    local_78._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[2] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [2];
    local_78._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[5] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[5];
    local_68._8_4_ = SUB84(dVar9,0);
    local_68._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[4] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [4];
    local_68._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[7] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[7];
    local_58._8_4_ = SUB84(dVar9,0);
    local_58._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[6] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [6];
    local_58._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[9] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[9];
    local_48._8_4_ = SUB84(dVar9,0);
    local_48._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[8] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [8];
    local_48._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xb] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xb];
    local_38._8_4_ = SUB84(dVar9,0);
    local_38._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[10] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [10];
    local_38._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xd] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xd];
    local_28._8_4_ = SUB84(dVar9,0);
    local_28._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0xc] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xc];
    local_28._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar9 = (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
            m_storage.m_data.array[0xf] -
            (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
            array[0xf];
    local_18._8_4_ = SUB84(dVar9,0);
    local_18._0_8_ =
         (this->super_VCCluster).E.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
         m_storage.m_data.array[0xe] -
         (f->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
         [0xe];
    local_18._12_4_ = (int)((ulong)dVar9 >> 0x20);
    dVar1 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[1];
    dVar5 = f->area;
    dVar6 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[0];
    dVar7 = (this->super_VCCluster).weightedSum.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    dVar8 = (this->super_VCCluster).weightedSum.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    dVar2 = (f->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
            m_data.array[2];
    dVar3 = (this->super_VCCluster).weightedSum.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    dVar4 = (this->super_VCCluster).area - dVar5;
    center(&local_a8,this,(Matrix4d *)local_88);
    dVar9 = 0.0;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar9 = (dVar8 - dVar1 * dVar5) *
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[1] +
              (dVar3 - dVar2 * dVar5) *
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[2] +
              (dVar7 - dVar5 * dVar6) *
              local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array[0];
      dVar9 = dVar4 * (local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] *
                       local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[1] +
                       local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] *
                       local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array[2] +
                      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0] *
                      local_a8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array[0]) - (dVar9 + dVar9);
    }
  }
  return dVar9;
}

Assistant:

double VCClusterQuad::energyWithoutItem(VCFace* f) {
	if (items.size() <= 1)
		return ENG_NULL;
	Matrix4d Eo = E - f->E;
	Vector3d ws = weightedSum - f->center * f->area;
	double a = area - f->area;
	Vector3d zi = center(Eo);
	return a == 0 ? ENG_NULL : a * zi.dot(zi) - 2 * zi.dot(ws);
}